

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<3UL> * physical_model::gyroscope(void)

{
  long lVar1;
  vector<3UL> *in_RDI;
  result_type_conflict1 rVar2;
  result_type_conflict1 rVar3;
  matrix<3UL,_1UL> result_1;
  matrix<3UL,_1UL> result;
  float local_40 [2];
  undefined8 local_38;
  float local_30;
  float local_28 [6];
  
  rVar2 = std::normal_distribution<float>::operator()
                    ((normal_distribution<float> *)gyr_noise_x,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)gen,(param_type *)gyr_noise_x);
  rVar3 = std::normal_distribution<float>::operator()
                    ((normal_distribution<float> *)gyr_noise_y,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)gen,(param_type *)gyr_noise_y);
  local_30 = std::normal_distribution<float>::operator()
                       ((normal_distribution<float> *)gyr_noise_z,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)gen,(param_type *)gyr_noise_z);
  local_38 = CONCAT44(rVar3,rVar2);
  lVar1 = 2;
  do {
    gyroscope::random_walk.super_matrix<3UL,_1UL>.data[lVar1 + -2][0] =
         local_40[lVar1] + gyroscope::random_walk.super_matrix<3UL,_1UL>.data[lVar1 + -2][0];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  local_28[4] = 0.0;
  lVar1 = 2;
  do {
    local_28[lVar1] = *(float *)(gyr_real + lVar1 * 4) + *(float *)(gyr_bias + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  local_38 = 0;
  local_30 = 0.0;
  lVar1 = 2;
  do {
    local_40[lVar1] =
         local_28[lVar1] + gyroscope::random_walk.super_matrix<3UL,_1UL>.data[lVar1 + -2][0];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  (in_RDI->super_matrix<3UL,_1UL>)._vptr_matrix = (_func_int **)&PTR_to_string_abi_cxx11__00107ce8;
  *(undefined8 *)(in_RDI->super_matrix<3UL,_1UL>).data = local_38;
  (in_RDI->super_matrix<3UL,_1UL>).data[2][0] = local_30;
  return in_RDI;
}

Assistant:

const blas::vector<3> gyroscope() {
        static blas::vector<3> random_walk;
        random_walk += {gyr_noise_x(gen), gyr_noise_y(gen), gyr_noise_z(gen)};
        return gyr_real + gyr_bias + random_walk;
    }